

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(std::array<char,32ul>,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>,std::__cxx11::string),std::array<char,32ul>&,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>&,std::__cxx11::string&>
          (session_handle *this,offset_in_session_impl_to_subr f,array<char,_32UL> *a,
          function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *a_1,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_2)

{
  io_context *ctx;
  string *in_R9;
  shared_ptr<libtorrent::aux::session_impl> s;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b0 [32];
  char local_90 [8];
  char acStack_88 [8];
  _Manager_type local_80;
  _Invoker_type p_Stack_78;
  function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_70;
  string local_50 [32];
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c0,this);
  if (local_c0._M_ptr != (element_type *)0x0) {
    ctx = (local_c0._M_ptr)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)local_b0,
               &local_c0);
    local_90 = *(char (*) [8])&(a_1->super__Function_base)._M_functor;
    acStack_88 = *(char (*) [8])((long)&(a_1->super__Function_base)._M_functor + 8);
    local_80 = (a_1->super__Function_base)._M_manager;
    p_Stack_78 = a_1->_M_invoker;
    local_b0._16_8_ = f;
    local_b0._24_8_ = a;
    ::std::
    function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_70,
               (function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)a_2);
    ::std::__cxx11::string::string(local_50,in_R9);
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(std::array<char,32ul>,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>,std::__cxx11::string),std::array<char,32ul>&,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>&,std::__cxx11::string&>(void(libtorrent::aux::session_impl::*)(std::array<char,32ul>,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>,std::__cxx11::string),std::array<char,32ul>&,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>&,std::__cxx11::string&)const::_lambda()_1_>
              (ctx,(type_conflict9 *)local_b0,(type *)0x0);
    const::{lambda()#1}::~async_call((_lambda___1_ *)local_b0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    return;
  }
  local_b0._0_4_ = invalid_session_handle;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_b0);
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}